

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ResultBuilder * __thiscall
Catch::ExpressionLhs<std::_V2::error_category_const&>::
captureExpression<(Catch::Internal::Operator)0,std::_V2::error_category>
          (ExpressionLhs<std::_V2::error_category_const&> *this,error_category *rhs)

{
  bool result;
  ResultBuilder *pRVar1;
  char *__s;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_38;
  error_category *local_18;
  error_category *rhs_local;
  ExpressionLhs<const_std::_V2::error_category_&> *this_local;
  
  pRVar1 = *(ResultBuilder **)this;
  local_18 = rhs;
  rhs_local = (error_category *)this;
  result = Internal::
           compare<(Catch::Internal::Operator)0,std::_V2::error_category,std::_V2::error_category>
                     (*(error_category **)(this + 8),rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  toString<std::_V2::error_category>(&local_38,*(error_category **)(this + 8));
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  toString<std::_V2::error_category>(&local_68,local_18);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_68);
  __s = Internal::OperatorTraits<(Catch::Internal::Operator)0>::getName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }